

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_get_byoffset_raw(fdb_kvs_handle *handle,fdb_doc *doc)

{
  ushort uVar1;
  uint64_t offset;
  int64_t iVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  uint uVar6;
  int64_t iVar7;
  size_t sVar8;
  bool bVar9;
  ushort uVar10;
  undefined1 auVar11 [16];
  docio_object _doc;
  fdb_kvs_id_t kv_id;
  undefined6 uVar12;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (doc != (fdb_doc *)0x0) {
    offset = doc->offset;
    _doc.length.keylen = 0;
    _doc.length.metalen = 0;
    _doc.length.bodylen = 0;
    _doc.length.bodylen_ondisk = 0;
    _doc.length.flag = '\0';
    _doc.length.checksum = '\0';
    _doc.length.reserved = 0;
    _doc.timestamp = 0;
    _doc.key = (void *)0x0;
    _doc.field_3.seqnum = 0;
    _doc.meta = (void *)0x0;
    _doc.body = (void *)0x0;
    if (1 < offset + 1) {
      LOCK();
      bVar9 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
      if (bVar9) {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
      }
      UNLOCK();
      if (!bVar9) {
        return FDB_RESULT_HANDLE_BUSY;
      }
      atomic_incr_uint64_t(&handle->op_stats->num_gets,memory_order_relaxed);
      _doc.length.keylen = 0;
      _doc.length.metalen = 0;
      _doc.length.bodylen = 0;
      _doc.length.bodylen_ondisk = 0;
      _doc.length.flag = '\0';
      _doc.length.checksum = '\0';
      _doc.length.reserved = 0;
      _doc.timestamp = 0;
      _doc._20_4_ = 0;
      _doc.key = (void *)0x0;
      _doc.field_3.seqnum = 0;
      _doc.meta = (void *)0x0;
      _doc.body = (void *)0x0;
      iVar7 = docio_read_doc(handle->dhandle,offset,&_doc,true);
      if ((_doc.key != (void *)0x0 && 0 < iVar7) &&
         (((undefined1  [16])_doc.length & (undefined1  [16])0x1000000000) == (undefined1  [16])0x0)
         ) {
        if (handle->kvs != (kvs_info *)0x0) {
          buf2kvid((ulong)(handle->config).chunksize,_doc.key,&kv_id);
          if (kv_id != handle->kvs->id) {
            LOCK();
            if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
              (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
            }
            UNLOCK();
            free_docio_object(&_doc,'\x01','\x01','\x01');
            return FDB_RESULT_KEY_NOT_FOUND;
          }
          uVar1 = (handle->config).chunksize;
          uVar6 = _doc.length._0_4_ - (uint)uVar1;
          _doc.length.keylen = (keylen_t)uVar6;
          memmove(_doc.key,(void *)((ulong)uVar1 + (long)_doc.key),(ulong)(uVar6 & 0xffff));
        }
        doc->seqnum = (fdb_seqnum_t)_doc.field_3;
        auVar3._10_2_ = 0;
        auVar3._0_10_ = _doc.length._0_10_;
        auVar3._12_2_ = _doc.length.bodylen._2_2_;
        auVar4._8_2_ = (short)_doc.length.bodylen;
        auVar4._0_8_ = _doc.length._0_8_;
        auVar4._10_4_ = auVar3._10_4_;
        auVar5._6_8_ = 0;
        auVar5._0_6_ = auVar4._8_6_;
        uVar10 = _doc.length.keylen;
        uVar12 = 0;
        auVar11._0_8_ = CONCAT62(uVar12,uVar10);
        auVar11._8_4_ = (int)CONCAT82(SUB148(auVar5 << 0x40,6),_doc.length.metalen);
        auVar11._12_4_ = 0;
        doc->keylen = auVar11._0_8_;
        doc->metalen = auVar11._8_8_;
        doc->bodylen = (ulong)_doc.length.bodylen;
        if (doc->key == (void *)0x0) {
          doc->key = _doc.key;
        }
        else {
          free(_doc.key);
        }
        if (doc->meta == (void *)0x0) {
          doc->meta = _doc.meta;
        }
        else {
          free(_doc.meta);
        }
        if (doc->body == (void *)0x0) {
          doc->body = _doc.body;
        }
        else {
          if ((ulong)_doc.length.bodylen != 0) {
            memcpy(doc->body,_doc.body,(ulong)_doc.length.bodylen);
          }
          free(_doc.body);
        }
        doc->deleted = (bool)(_doc.length.flag >> 2 & 1);
        sVar8 = (ulong)((_doc.length._0_4_ & 0xffff) + ((uint)_doc.length._0_4_ >> 0x10) +
                       _doc.length.bodylen_ondisk) + 0x20;
        doc->size_ondisk = sVar8;
        if (handle->kvs != (kvs_info *)0x0) {
          doc->size_ondisk = sVar8 + (handle->config).chunksize;
        }
        LOCK();
        if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
          (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
        }
        UNLOCK();
        return (uint)(((undefined1  [13])_doc.length._0_13_ & (undefined1  [13])0x400000000) ==
                     (undefined1  [13])0x0) * 9 + FDB_RESULT_KEY_NOT_FOUND;
      }
      LOCK();
      if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
      }
      UNLOCK();
      iVar2 = -9;
      if (iVar7 < 0) {
        iVar2 = iVar7;
      }
      return (fdb_status)iVar2;
    }
  }
  return FDB_RESULT_INVALID_ARGS;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_byoffset_raw(fdb_kvs_handle *handle, fdb_doc *doc)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc) {
        return FDB_RESULT_INVALID_ARGS;
    }

    uint64_t offset = doc->offset;
    struct docio_object _doc;

    if (!offset || offset == BLK_NOT_FOUND) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);
    memset(&_doc, 0, sizeof(struct docio_object));

    int64_t _offset = docio_read_doc(handle->dhandle, offset, &_doc, true);
    if (_offset <= 0 || !_doc.key || (_doc.length.flag & DOCIO_TXN_COMMITTED)) {
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
    }

    if (handle->kvs) {
        fdb_kvs_id_t kv_id;
        buf2kvid(handle->config.chunksize, _doc.key, &kv_id);
        if (kv_id != handle->kvs->id) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            free_docio_object(&_doc, 1, 1, 1);
            return FDB_RESULT_KEY_NOT_FOUND;
        }
        _remove_kv_id(handle, &_doc);
    }

    doc->seqnum = _doc.seqnum;
    doc->keylen = _doc.length.keylen;
    doc->metalen = _doc.length.metalen;
    doc->bodylen = _doc.length.bodylen;
    if (doc->key) {
        free(_doc.key);
    } else {
        doc->key = _doc.key;
    }
    if (doc->meta) {
        free(_doc.meta);
    } else {
        doc->meta = _doc.meta;
    }
    if (doc->body) {
        if (_doc.length.bodylen > 0) {
            memcpy(doc->body, _doc.body, _doc.length.bodylen);
        }
        free(_doc.body);
    } else {
        doc->body = _doc.body;
    }
    doc->deleted = _doc.length.flag & DOCIO_DELETED;
    doc->size_ondisk = _fdb_get_docsize(_doc.length);
    if (handle->kvs) {
        // Since _doc.length was adjusted in _remove_kv_id(),
        // we need to compensate it.
        doc->size_ondisk += handle->config.chunksize;
    }

    if (_doc.length.flag & DOCIO_DELETED) {
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_KEY_NOT_FOUND;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}